

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_cHRM(ucvector *out,LodePNGInfo *info)

{
  uchar *puStack_28;
  uint error;
  uchar *chunk;
  LodePNGInfo *info_local;
  ucvector *out_local;
  
  chunk = (uchar *)info;
  info_local = (LodePNGInfo *)out;
  out_local._4_4_ = lodepng_chunk_init(&stack0xffffffffffffffd8,out,0x20,"cHRM");
  if (out_local._4_4_ == 0) {
    lodepng_set32bitInt(puStack_28 + 8,*(uint *)(chunk + 0xc0));
    lodepng_set32bitInt(puStack_28 + 0xc,*(uint *)(chunk + 0xc4));
    lodepng_set32bitInt(puStack_28 + 0x10,*(uint *)(chunk + 200));
    lodepng_set32bitInt(puStack_28 + 0x14,*(uint *)(chunk + 0xcc));
    lodepng_set32bitInt(puStack_28 + 0x18,*(uint *)(chunk + 0xd0));
    lodepng_set32bitInt(puStack_28 + 0x1c,*(uint *)(chunk + 0xd4));
    lodepng_set32bitInt(puStack_28 + 0x20,*(uint *)(chunk + 0xd8));
    lodepng_set32bitInt(puStack_28 + 0x24,*(uint *)(chunk + 0xdc));
    lodepng_chunk_generate_crc(puStack_28);
    out_local._4_4_ = 0;
  }
  return out_local._4_4_;
}

Assistant:

static unsigned addChunk_cHRM(ucvector* out, const LodePNGInfo* info) {
  unsigned char* chunk;
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 32, "cHRM"));
  lodepng_set32bitInt(chunk + 8, info->chrm_white_x);
  lodepng_set32bitInt(chunk + 12, info->chrm_white_y);
  lodepng_set32bitInt(chunk + 16, info->chrm_red_x);
  lodepng_set32bitInt(chunk + 20, info->chrm_red_y);
  lodepng_set32bitInt(chunk + 24, info->chrm_green_x);
  lodepng_set32bitInt(chunk + 28, info->chrm_green_y);
  lodepng_set32bitInt(chunk + 32, info->chrm_blue_x);
  lodepng_set32bitInt(chunk + 36, info->chrm_blue_y);
  lodepng_chunk_generate_crc(chunk);
  return 0;
}